

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext *ctx,ExprBlock *node)

{
  ExprBase *expression;
  LLVMValueRef pLVar1;
  IntrusiveList<ExprBase> *pIVar2;
  
  pIVar2 = &node->expressions;
  while (expression = pIVar2->head, expression != (ExprBase *)0x0) {
    CompileLlvm(ctx,expression);
    pIVar2 = (IntrusiveList<ExprBase> *)&expression->next;
  }
  if (node->closures != (ExprBase *)0x0) {
    CompileLlvm(ctx,node->closures);
  }
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)0x0);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmBlock(LlvmCompilationContext &ctx, ExprBlock *node)
{
	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileLlvm(ctx, value);

	if(node->closures)
		CompileLlvm(ctx, node->closures);

	return CheckType(ctx, node, NULL);
}